

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

MQTTCODEC_HANDLE mqtt_codec_create(ON_PACKET_COMPLETE_CALLBACK packetComplete,void *callbackCtx)

{
  MQTTCODEC_INSTANCE *codec_data;
  MQTTCODEC_HANDLE result;
  void *callbackCtx_local;
  ON_PACKET_COMPLETE_CALLBACK packetComplete_local;
  
  codec_data = (MQTTCODEC_INSTANCE *)malloc(0x40);
  if (codec_data != (MQTTCODEC_INSTANCE *)0x0) {
    clear_codec_data(codec_data);
    codec_data->packetComplete = packetComplete;
    codec_data->callContext = callbackCtx;
  }
  return codec_data;
}

Assistant:

MQTTCODEC_HANDLE mqtt_codec_create(ON_PACKET_COMPLETE_CALLBACK packetComplete, void* callbackCtx)
{
    MQTTCODEC_HANDLE result;
    result = malloc(sizeof(MQTTCODEC_INSTANCE));
    /* Codes_SRS_MQTT_CODEC_07_001: [If a failure is encountered then mqtt_codec_create shall return NULL.] */
    if (result != NULL)
    {
        /* Codes_SRS_MQTT_CODEC_07_002: [On success mqtt_codec_create shall return a MQTTCODEC_HANDLE value.] */
        clear_codec_data(result);
        result->packetComplete = packetComplete;
        result->callContext = callbackCtx;
    }
    return result;
}